

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wline_info(OutputFile *this,uint32_t l,char *fn)

{
  ostream *o;
  char *fn_local;
  uint32_t l_local;
  OutputFile *this_local;
  
  o = stream(this);
  output_line_info(o,l,fn);
  return this;
}

Assistant:

OutputFile & OutputFile::wline_info (uint32_t l, const char * fn)
{
	output_line_info (stream (), l, fn);
	return *this;
}